

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_any.h
# Opt level: O0

void UnitTests::stream_any_details::
     output_range_or_type<std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
               (ostream *s,
               list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *t,true_type *param_3)

{
  _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *s_00;
  bool bVar1;
  reference t_00;
  const_iterator __last;
  _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  outputter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  const_iterator first;
  _Self local_28;
  true_type *local_20;
  true_type *param_2_local;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *t_local;
  ostream *s_local;
  
  local_20 = param_3;
  param_2_local = (true_type *)t;
  t_local = (list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)s;
  std::operator<<(s,"[");
  local_28._M_node =
       (_List_node_base *)
       std::begin<std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                 ((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)param_2_local);
  first = std::end<std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                    ((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)param_2_local);
  bVar1 = std::operator!=(&local_28,&first);
  if (bVar1) {
    local_38._M_node =
         (_List_node_base *)
         std::begin<std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                   ((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)param_2_local);
    s_00 = t_local;
    local_48._M_node =
         (_List_node_base *)
         std::
         _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ::operator++(&local_38,0);
    t_00 = std::
           _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::operator*(&local_48);
    local_40 = stream_any<std::__cxx11::string>(t_00);
    operator<<((ostream *)s_00,&local_40);
    __first._M_node = local_38._M_node;
    __last = std::end<std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                       ((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)param_2_local);
    std::
    for_each<std::_List_const_iterator<std::__cxx11::string>,UnitTests::stream_any_details::output_range_or_type<std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>>(std::ostream&,std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::integral_constant<bool,true>const&)::_lambda(auto:1_const&)_1_>
              (__first,(_List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )__last._M_node,(anon_class_8_1_54a39813)t_local);
  }
  std::operator<<((ostream *)t_local,"]");
  return;
}

Assistant:

void output_range_or_type(std::ostream& s, const T& t, const std::true_type& /*unused*/)
        {
            s << "[";
            if (begin(t) != end(t))
            {
                auto first = begin(t);
                s << stream_any(*first++);
                std::for_each(first, end(t), [&s](const auto& value) { s << ", " << stream_any(value); });
            }
            s << "]";
        }